

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::QLineEdit(QLineEdit *this,QString *contents,QWidget *parent)

{
  long lVar1;
  QLineEditPrivate *this_00;
  QWidget *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QLineEditPrivate *d;
  QLineEditPrivate *in_stack_ffffffffffffffc0;
  QWidget *in_stack_ffffffffffffffd0;
  QWidget *pQVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0x2f8);
  QLineEditPrivate::QLineEditPrivate(in_stack_ffffffffffffffc0);
  pQVar2 = in_RDX;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x5c37a1);
  QWidget::QWidget(in_stack_ffffffffffffffd0,in_RDI,in_RDX,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)pQVar2 >> 0x20,0));
  *(undefined ***)in_RDI = &PTR_metaObject_00d14fc8;
  *(undefined ***)&in_RDI->field_0x10 = &PTR__QLineEdit_00d15180;
  this_00 = d_func((QLineEdit *)0x5c37dd);
  QLineEditPrivate::init(this_00,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLineEdit::QLineEdit(const QString& contents, QWidget* parent)
    : QWidget(*new QLineEditPrivate, parent, { })
{
    Q_D(QLineEdit);
    d->init(contents);
}